

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LL.cpp
# Opt level: O2

void __thiscall ll_grammar::ElemLeft::ElemLeft(ElemLeft *this,string *name,int key,bool isFinally)

{
  string local_40;
  
  std::__cxx11::string::string((string *)&local_40,(string *)name);
  base_grammar::Elem::Elem(&this->super_Elem,&local_40,key,isFinally);
  std::__cxx11::string::~string((string *)&local_40);
  (this->expression_of_set).
  super__Vector_base<ll_grammar::ExpressLeft,_std::allocator<ll_grammar::ExpressLeft>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->expression_of_set).
  super__Vector_base<ll_grammar::ExpressLeft,_std::allocator<ll_grammar::ExpressLeft>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->expression_of_set).
  super__Vector_base<ll_grammar::ExpressLeft,_std::allocator<ll_grammar::ExpressLeft>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

ElemLeft::ElemLeft(string name, int key, bool isFinally) : Elem(name, key, isFinally){}